

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.c
# Opt level: O0

char * OSSL_trace_get_category_name(int num)

{
  size_t i;
  int num_local;
  
  i = 0;
  while( true ) {
    if (0x10 < i) {
      return (char *)0x0;
    }
    if (trace_categories[i].num == num) break;
    i = i + 1;
  }
  return trace_categories[i].name;
}

Assistant:

const char *OSSL_trace_get_category_name(int num)
{
    size_t i;

    for (i = 0; i < OSSL_NELEM(trace_categories); i++)
        if (trace_categories[i].num == num)
            return trace_categories[i].name;
    return NULL; /* not found */
}